

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 __thiscall
DROPlayer::GetSongDeviceInfo
          (DROPlayer *this,vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *devInfList)

{
  bool bVar1;
  size_type __n;
  DEV_GEN_CFG *pDVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  UINT32 local_6c;
  VGM_BASEDEV *cDev;
  PLR_DEV_INFO devInf;
  DEV_GEN_CFG *devCfg;
  size_t curDev;
  vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *devInfList_local;
  DROPlayer *this_local;
  
  if (this->_dLoad == (DATA_LOADER *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::clear(devInfList);
    __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes);
    std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::reserve(devInfList,__n);
    devCfg = (DEV_GEN_CFG *)0x0;
    while( true ) {
      pDVar2 = (DEV_GEN_CFG *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes);
      if (pDVar2 <= devCfg) break;
      devInf.devCfg =
           std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::operator[]
                     (&this->_devCfgs,(size_type)devCfg);
      memset(&cDev,0,0x18);
      cDev._0_4_ = SUB84(devCfg,0);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->_devTypes,(size_type)devCfg);
      cDev._4_1_ = *pvVar3;
      cDev._5_1_ = SUB81(devCfg,0);
      devInf._8_8_ = devInf.devCfg;
      bVar1 = std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::empty
                        (&this->_devices);
      if (bVar1) {
        devInf.id = 0;
        cDev._6_2_ = 0x100;
        devInf.type = '\0';
        devInf.instance = '\0';
        devInf.volume = 0;
      }
      else {
        pvVar4 = std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::
                 operator[](&this->_devices,(size_type)devCfg);
        if ((pvVar4->base).defInf.devDef == (DEV_DEF *)0x0) {
          local_6c = 0;
        }
        else {
          local_6c = ((pvVar4->base).defInf.devDef)->coreID;
        }
        devInf.id = local_6c;
        cDev._6_2_ = (undefined2)
                     (((int)(pvVar4->base).resmpl.volumeL + (int)(pvVar4->base).resmpl.volumeR) / 2)
        ;
        devInf._4_4_ = (pvVar4->base).defInf.sampleRate;
      }
      std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::push_back
                (devInfList,(value_type *)&cDev);
      devCfg = (DEV_GEN_CFG *)((long)&devCfg->emuCore + 1);
    }
    bVar1 = std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::empty
                      (&this->_devices);
    if (bVar1) {
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = '\x01';
    }
  }
  return this_local._7_1_;
}

Assistant:

UINT8 DROPlayer::GetSongDeviceInfo(std::vector<PLR_DEV_INFO>& devInfList) const
{
	if (_dLoad == NULL)
		return 0xFF;
	
	size_t curDev;
	
	devInfList.clear();
	devInfList.reserve(_devTypes.size());
	for (curDev = 0; curDev < _devTypes.size(); curDev ++)
	{
		const DEV_GEN_CFG* devCfg = &_devCfgs[curDev];
		PLR_DEV_INFO devInf;
		memset(&devInf, 0x00, sizeof(PLR_DEV_INFO));
		
		devInf.id = (UINT32)curDev;
		devInf.type = _devTypes[curDev];
		devInf.instance = (UINT8)curDev;
		devInf.devCfg = devCfg;
		if (! _devices.empty())
		{
			const VGM_BASEDEV& cDev = _devices[curDev].base;
			devInf.core = (cDev.defInf.devDef != NULL) ? cDev.defInf.devDef->coreID : 0x00;
			devInf.volume = (cDev.resmpl.volumeL + cDev.resmpl.volumeR) / 2;
			devInf.smplRate = cDev.defInf.sampleRate;
		}
		else
		{
			devInf.core = 0x00;
			devInf.volume = 0x100;
			devInf.smplRate = 0;
		}
		devInfList.push_back(devInf);
	}
	if (! _devices.empty())
		return 0x01;	// returned "live" data
	else
		return 0x00;	// returned data based on file header
}